

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void __thiscall
CodeGenGenericContext::OverwriteRegisterWithUnknown(CodeGenGenericContext *this,x86Reg reg)

{
  KillRegister(this,reg);
  InvalidateDependand(this,reg);
  this->genReg[reg].type = argNone;
  this->genRegUpdate[reg] = (uint)(((long)this->x86Op - (long)this->x86Base) / 0x50);
  this->genRegRead[reg] = false;
  return;
}

Assistant:

void CodeGenGenericContext::OverwriteRegisterWithUnknown(x86Reg reg)
{
	// Destination is updated
	KillRegister(reg);
	InvalidateDependand(reg);

	genReg[reg].type = x86Argument::argNone;
	genRegUpdate[reg] = unsigned(x86Op - x86Base);
	genRegRead[reg] = false;
}